

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbox2d.cpp
# Opt level: O2

void masc::polygon::box2ply(obb *box,Polygon *poly)

{
  vector<svg::Point,_std::allocator<svg::Point>_> *this;
  value_type local_38;
  
  local_38.x = box->corners[0].v[0];
  local_38.y = box->corners[0].v[1];
  this = &poly->points;
  std::vector<svg::Point,_std::allocator<svg::Point>_>::push_back(this,&local_38);
  local_38.x = box->corners[1].v[0];
  local_38.y = box->corners[1].v[1];
  std::vector<svg::Point,_std::allocator<svg::Point>_>::push_back(this,&local_38);
  local_38.x = box->corners[2].v[0];
  local_38.y = box->corners[2].v[1];
  std::vector<svg::Point,_std::allocator<svg::Point>_>::push_back(this,&local_38);
  local_38.x = box->corners[3].v[0];
  local_38.y = box->corners[3].v[1];
  std::vector<svg::Point,_std::allocator<svg::Point>_>::push_back(this,&local_38);
  svg::Polygon::endBoundary(poly);
  return;
}

Assistant:

void box2ply(const masc::polygon::obb& box, svg::Polygon& poly)
{
    poly << svg::Point(box.corners[0][0], box.corners[0][1]);
    poly << svg::Point(box.corners[1][0], box.corners[1][1]);
    poly << svg::Point(box.corners[2][0], box.corners[2][1]);
    poly << svg::Point(box.corners[3][0], box.corners[3][1]);
    poly.endBoundary();
}